

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_options<char>::basic_json_options
          (basic_json_options<char> *this,basic_json_options<char> *param_1)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  
  basic_json_options_common<char>::basic_json_options_common
            ((basic_json_options_common<char> *)
             &(this->super_basic_json_decode_options<char>).field_0x70,
             (basic_json_options_common<char> *)
             &(param_1->super_basic_json_decode_options<char>).field_0x70);
  (this->super_basic_json_decode_options<char>)._vptr_basic_json_decode_options =
       (_func_int **)&PTR__basic_json_decode_options_00b59020;
  *(undefined ***)&(this->super_basic_json_decode_options<char>).field_0x70 =
       &PTR__basic_json_decode_options_00b59048;
  bVar5 = (param_1->super_basic_json_decode_options<char>).allow_comments_;
  (this->super_basic_json_decode_options<char>).lossless_number_ =
       (param_1->super_basic_json_decode_options<char>).lossless_number_;
  (this->super_basic_json_decode_options<char>).allow_comments_ = bVar5;
  (this->super_basic_json_decode_options<char>).allow_trailing_comma_ =
       (param_1->super_basic_json_decode_options<char>).allow_trailing_comma_;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            (&(this->super_basic_json_decode_options<char>).err_handler_,
             &(param_1->super_basic_json_decode_options<char>).err_handler_);
  *(undefined8 *)&(this->super_basic_json_decode_options<char>).field_0x30 = 0xb590a8;
  *(undefined8 *)&(this->super_basic_json_decode_options<char>).field_0x70 = 0xb590d0;
  uVar2 = *(undefined4 *)&(param_1->super_basic_json_decode_options<char>).field_0x3c;
  uVar3 = *(undefined4 *)&(param_1->super_basic_json_decode_options<char>).field_0x40;
  uVar4 = *(undefined4 *)&(param_1->super_basic_json_decode_options<char>).field_0x44;
  *(undefined4 *)&(this->super_basic_json_decode_options<char>).field_0x38 =
       *(undefined4 *)&(param_1->super_basic_json_decode_options<char>).field_0x38;
  *(undefined4 *)&(this->super_basic_json_decode_options<char>).field_0x3c = uVar2;
  *(undefined4 *)&(this->super_basic_json_decode_options<char>).field_0x40 = uVar3;
  *(undefined4 *)&(this->super_basic_json_decode_options<char>).field_0x44 = uVar4;
  *(undefined8 *)&(this->super_basic_json_decode_options<char>).field_0x48 =
       *(undefined8 *)&(param_1->super_basic_json_decode_options<char>).field_0x48;
  *(undefined1 **)&(this->super_basic_json_decode_options<char>).field_0x50 =
       &(this->super_basic_json_decode_options<char>).field_0x60;
  lVar1 = *(long *)&(param_1->super_basic_json_decode_options<char>).field_0x50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_basic_json_decode_options<char>).field_0x50,lVar1,
             *(long *)&(param_1->super_basic_json_decode_options<char>).field_0x58 + lVar1);
  (this->super_basic_json_decode_options<char>)._vptr_basic_json_decode_options =
       (_func_int **)0xb58f70;
  *(undefined8 *)&(this->super_basic_json_decode_options<char>).field_0x70 = 0xb58fc0;
  *(undefined8 *)&(this->super_basic_json_decode_options<char>).field_0x30 = 0xb58f98;
  return;
}

Assistant:

basic_json_options(const basic_json_options&) = default;